

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O1

void StringFormatter<unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_char&,unsigned_short&,unsigned_int&,unsigned_long&>
     ::format<unsigned_char,unsigned_short&,unsigned_int&,unsigned_long&>
               (ostream *os,char *fmt,uchar *value,unsigned_short *args,uint *args_1,
               unsigned_long *args_2)

{
  ostream *poVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  long lVar5;
  uint *args_00;
  uchar *puVar6;
  ostream oVar7;
  long lVar8;
  void *pvVar9;
  runtime_error *this;
  uint uVar10;
  char *pcVar11;
  bool bVar12;
  char *__nptr;
  char *pcVar13;
  char *q;
  ostream local_7d;
  char local_7b;
  char local_7a;
  uchar local_79;
  undefined8 local_78;
  long local_70;
  char *local_68;
  uint *local_60;
  long local_58;
  unsigned_long *local_50;
  uchar *local_48;
  unsigned_short *local_40;
  char *local_38;
  
  local_60 = args_1;
  local_48 = value;
  local_40 = args;
  while( true ) {
    for (; cVar2 = *fmt, cVar2 != '%'; fmt = fmt + 1) {
      if (cVar2 == '\0') {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"too many arguments for format");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_7a = cVar2;
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_7a,1);
    }
    cVar2 = fmt[1];
    if (cVar2 != '%') break;
    fmt = fmt + 2;
    local_7b = cVar2;
    std::__ostream_insert<char,std::char_traits<char>>(os,&local_7b,1);
  }
  pcVar11 = fmt + (cVar2 == '-');
  cVar3 = fmt[(ulong)(cVar2 == '-') + 1];
  bVar12 = cVar3 == ' ' || cVar3 == '+';
  __nptr = pcVar11 + (ulong)bVar12 + 1;
  if (*__nptr == ',') {
    __nptr = pcVar11 + (ulong)bVar12 + 2;
    local_7d = (ostream)0x2c;
  }
  else if (*__nptr == '0') {
    __nptr = pcVar11 + (ulong)bVar12 + 2;
    local_7d = (ostream)0x30;
  }
  else {
    local_7d = (ostream)0x20;
  }
  local_50 = args_2;
  local_58 = strtol(__nptr,&local_38,10);
  local_68 = local_38;
  if (*local_38 == '.') {
    pcVar13 = local_38 + 1;
    lVar8 = strtol(pcVar13,&local_38,10);
    local_78 = CONCAT71((int7)((ulong)pcVar11 >> 8),pcVar13 != local_38);
    local_70 = (long)(int)lVar8;
  }
  else {
    local_70 = 0;
    local_78 = 0;
  }
  do {
    pcVar11 = local_38;
    cVar4 = *pcVar11;
    pvVar9 = memchr("qhlLzjt",(int)cVar4,8);
    args_00 = local_60;
    local_38 = pcVar11 + 1;
  } while (pvVar9 != (void *)0x0);
  pcVar13 = pcVar11;
  if ((cVar4 == 'I') && (pcVar13 = pcVar11 + 1, (byte)(pcVar11[2] | 2U) == 0x36)) {
    pcVar13 = pcVar11 + 3;
  }
  cVar4 = *pcVar13;
  StringFormatter<unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_char_&,_unsigned_short_&,_unsigned_int_&,_unsigned_long_&>
  ::applytype(os,cVar4);
  lVar8 = *(long *)(*(long *)os + -0x18);
  if (cVar3 == '+') {
    uVar10 = *(uint *)(os + lVar8 + 0x18) | 0x800;
  }
  else {
    uVar10 = *(uint *)(os + lVar8 + 0x18) & 0xfffff7ff;
  }
  *(uint *)(os + lVar8 + 0x18) = uVar10;
  if (cVar2 == '-' || cVar3 == '+') {
    *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
         (uint)(cVar2 == '-') * 0x10 +
         (*(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffff4f) + 0x10;
  }
  lVar8 = *(long *)os;
  lVar5 = *(long *)(lVar8 + -0x18);
  if (__nptr == local_68) {
    *(undefined8 *)(os + lVar5 + 0x10) = 0;
  }
  else {
    *(long *)(os + lVar5 + 0x10) = (long)(int)local_58;
    if (cVar2 != '-' && cVar3 != '+') {
      lVar8 = *(long *)(lVar8 + -0x18);
      *(uint *)(os + lVar8 + 0x18) = *(uint *)(os + lVar8 + 0x18) & 0xffffff4f | 0x80;
    }
  }
  if ((char)local_78 != '\0') {
    *(long *)(os + *(long *)(*(long *)os + -0x18) + 8) = local_70;
  }
  poVar1 = os + *(long *)(*(long *)os + -0x18);
  if (os[*(long *)(*(long *)os + -0x18) + 0xe1] == (ostream)0x0) {
    oVar7 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar7;
    poVar1[0xe1] = (ostream)0x1;
  }
  puVar6 = local_48;
  poVar1[0xe0] = local_7d;
  if ((cVar4 != 'c') ||
     (bVar12 = StringFormatter<unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_char_&,_unsigned_short_&,_unsigned_int_&,_unsigned_long_&>
               ::output_wchar<unsigned_char>(os,local_48), !bVar12)) {
    pvVar9 = memchr("iduoxX",(int)cVar4,7);
    if (pvVar9 == (void *)0x0) {
      local_79 = *puVar6;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_79,1);
    }
    else {
      std::ostream::_M_insert<unsigned_long>((ulong)os);
    }
  }
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 0;
  format<unsigned_short,unsigned_int&,unsigned_long&>
            (os,pcVar13 + (cVar4 != '\0'),local_40,args_00,local_50);
  return;
}

Assistant:

static void format(std::ostream& os, const char *fmt, T& value, FARGS&&...args) 
    {
        bool used_value = false;
        const char *p= fmt;
        while (*p) {
            if (*p=='%') {
                p++;
                if (*p=='%') {
                    os << *p++;
                }
                else {

                    // '-'  means left adjust
                    bool leftadjust= false;
                    if (*p=='-') {
                        p++;
                        leftadjust= true;
                    }
                    bool forcesign= false;
                    //bool blankforpositive= false;
                    if (*p=='+') {
                        p++;
                        forcesign= true;
                    }
                    else if (*p==' ') {
                        p++;
                        //blankforpositive= true;  // <-- todo
                    }
                    
                    // '0' means pad with zero
                    // ',' is useful for arrays
                    char padchar= ' ';

                    if (*p=='0') { p++; padchar='0'; }
                    else if (*p==',') { p++; padchar=','; }

                    // width specification
                    char *q;
                    // todo: support '*'  : take size from argumentlist.
                    // todo: support '#'  : adds 0, 0x, 0X prefix to oct/hex numbers -> 'showbase'
                    int width= strtol(p, &q, 10);
                    bool havewidth= p!=q;
                    p= q;

                    // precision after '.'
                    int precision= 0;
                    bool haveprecision= false;
                    if (*p=='.') {
                        p++;
                        // todo: support '*'
                        precision= strtol(p, &q, 10);
                        haveprecision= p!=q;
                        p= q;
                    }

                    // ignore argument size field
                    while (std::strchr("qhlLzjt", *p))
                        p++;
                    if (*p=='I') {
                        // microsoft I64 specifier
                        p++;
                        if (p[1]=='6' || p[1]=='4') {
                            p+=2;
                        }
                    }

                    char type= 0;
                    if (*p)
                        type= *p++;

                    // use formatting
                    applytype(os, type);
                    if (forcesign)
                        os << std::showpos;
                    else
                        os << std::noshowpos;

                    if (leftadjust)
                        os << std::left;
                    else if (forcesign) {
                        // exception: when forcing display of sign
                        // we need to use 'internal fill'
                        os << std::internal;
                    }

                    if (havewidth) {
                        os.width(width);
                        if (!leftadjust && !forcesign)
                            os << std::right;
                    }
                    else {
                        os.width(0);
                    }
                    // todo: support precision(truncate) for strings
                    if (haveprecision)
                        os.precision(precision);
                    os.fill(padchar);

                    if (type=='c' && output_wchar(os, value))
                    {
                        // nop
                    }
                    else if (type=='p' && output_pointer(os, value))
                    {
                        // nop
                    }
                    else if (type=='b' && output_hex_data(os, value))
                    {
                        // nop
                    }
                    else if (std::strchr("iduoxX", type) && output_int(os, value))
                    {
                        // nop
                    }
                    else if (type=='s' && output_null(os, value))
                    {
                        // nop
                    }
                    else if (output_using_operator(os, value))
                    {
                        // when type ~ float/double : '[AEFGaefg]' || type == 's' || other outputs failed.
                        // nop
                    }
                    else {
                        os << "<?>";
                    }

                    // TODO: improve float formatting

                    // reset precision
                    os.precision(0);

                    used_value = true;

                    format(os, p, args...);
                    return;
                }
            }
            else {
                os << *p++;
            }
        }

        if (!used_value)
            throw std::runtime_error("too many arguments for format");
    }